

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprNeedsNoAffinityChange(Expr *p,char aff)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  
  if (aff == 'A') {
    iVar3 = 1;
  }
  else {
    bVar2 = false;
    while( true ) {
      bVar1 = p->op;
      if (1 < bVar1 - 0xad) break;
      if (bVar1 == 0xae) {
        bVar2 = true;
      }
      p = p->pLeft;
    }
    if (bVar1 == 0xb0) {
      bVar1 = p->op2;
    }
    if (bVar1 == 0x76) {
      return (int)(aff == 'B' && !bVar2);
    }
    if (bVar1 == 0x9a) {
LAB_0018faa4:
      return (int)('B' < aff);
    }
    iVar3 = 0;
    if (bVar1 == 0x9b) {
      return (int)!bVar2;
    }
    if (bVar1 == 0xa8) {
      if ('B' < aff) {
        return (uint)((ushort)p->iColumn >> 0xf);
      }
    }
    else if (bVar1 == 0x9c) goto LAB_0018faa4;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprNeedsNoAffinityChange(const Expr *p, char aff){
  u8 op;
  int unaryMinus = 0;
  if( aff==SQLITE_AFF_BLOB ) return 1;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){
    if( p->op==TK_UMINUS ) unaryMinus = 1;
    p = p->pLeft;
  }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_FLOAT: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_STRING: {
      return !unaryMinus && aff==SQLITE_AFF_TEXT;
    }
    case TK_BLOB: {
      return !unaryMinus;
    }
    case TK_COLUMN: {
      assert( p->iTable>=0 );  /* p cannot be part of a CHECK constraint */
      return aff>=SQLITE_AFF_NUMERIC && p->iColumn<0;
    }
    default: {
      return 0;
    }
  }
}